

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

Collision * __thiscall
Scene::findNearestCollision
          (Collision *__return_storage_ptr__,Scene *this,Vector3 *start,Vector3 *dir)

{
  bool bVar1;
  reference ppLVar2;
  reference ppOVar3;
  undefined1 local_160 [8];
  Collision coll_1;
  Object *o;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Object_*,_std::allocator<Object_*>_> *__range1_1;
  Collision coll;
  Light *l;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Light_*,_std::allocator<Light_*>_> *__range1;
  Vector3 *dir_local;
  Vector3 *start_local;
  Scene *this_local;
  
  Collision::Collision(__return_storage_ptr__);
  __end1 = std::vector<Light_*,_std::allocator<Light_*>_>::begin(&this->m_lights);
  l = (Light *)std::vector<Light_*,_std::allocator<Light_*>_>::end(&this->m_lights);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>
                                     *)&l), bVar1) {
    ppLVar2 = __gnu_cxx::
              __normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
              operator*(&__end1);
    coll.is_internal = (double)*ppLVar2;
    (*((Light *)coll.is_internal)->_vptr_Light[3])(&__range1_1,coll.is_internal,start,dir);
    bVar1 = Collision::isHit((Collision *)&__range1_1);
    if ((bVar1) && (coll.n.z + 1e-06 < __return_storage_ptr__->dist)) {
      memcpy(__return_storage_ptr__,&__range1_1,0x80);
    }
    __gnu_cxx::__normal_iterator<Light_*const_*,_std::vector<Light_*,_std::allocator<Light_*>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<Object_*,_std::allocator<Object_*>_>::begin(&this->m_objects);
  o = (Object *)std::vector<Object_*,_std::allocator<Object_*>_>::end(&this->m_objects);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
                             *)&o), bVar1) {
    ppOVar3 = __gnu_cxx::
              __normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
              ::operator*(&__end1_1);
    coll_1.is_internal = (double)*ppOVar3;
    (*((Object *)coll_1.is_internal)->_vptr_Object[2])(local_160,coll_1.is_internal,start,dir);
    bVar1 = Collision::isHit((Collision *)local_160);
    if ((bVar1) && (coll_1.n.z + 1e-06 < __return_storage_ptr__->dist)) {
      memcpy(__return_storage_ptr__,local_160,0x80);
    }
    __gnu_cxx::__normal_iterator<Object_*const_*,_std::vector<Object_*,_std::allocator<Object_*>_>_>
    ::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Scene::findNearestCollision(const Vector3& start, const Vector3& dir) const
{
    Collision ret;
    for (auto l : m_lights)
    {
        Collision coll = l->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    for (auto o : m_objects)
    {
        Collision coll = o->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    return ret;
}